

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::MultiTransformNode::resetInDegree(MultiTransformNode *this)

{
  size_t *psVar1;
  Node *pNVar2;
  long lVar3;
  undefined8 in_RSI;
  
  (this->super_Node).closed = false;
  if ((this->super_Node).indegree == 1) {
    (*(((this->child).ptr)->super_RefCount)._vptr_RefCount[8])();
    lVar3 = (long)(this->spaces).
                  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->spaces).
                  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)(lVar3 / 0x30)) {
      pNVar2 = (this->child).ptr;
      (*(pNVar2->super_RefCount)._vptr_RefCount[8])(pNVar2,in_RSI,lVar3 % 0x30);
    }
  }
  psVar1 = &(this->super_Node).indegree;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void SceneGraph::MultiTransformNode::resetInDegree()
  {
    closed = false;
    if (indegree == 1) {
      child->resetInDegree();
      if (spaces.size() > 1) child->resetInDegree(); // break instance up when motion blur is used
    }
    indegree--;
  }